

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O1

CURLHcode curl_easy_header(CURL_conflict *easy,char *name,size_t nameindex,uint type,int request,
                          curl_header **hout)

{
  Curl_llist *list;
  Curl_llist_element *pCVar1;
  CURLHcode CVar2;
  int iVar3;
  CURLHcode CVar4;
  size_t sVar5;
  Curl_llist_element *pCVar6;
  void *pvVar7;
  Curl_easy *data;
  int iVar8;
  bool bVar9;
  void *local_68;
  Curl_llist_element *local_58;
  ulong local_50;
  
  CVar2 = CURLHE_BAD_ARGUMENT;
  CVar4 = CURLHE_BAD_ARGUMENT;
  if ((((-2 < request) && (CVar4 = CVar2, 0xffffffe0 < type - 0x20)) &&
      (easy != (CURL_conflict *)0x0)) && ((name != (char *)0x0 && (hout != (curl_header **)0x0)))) {
    list = &(easy->state).httphdrs;
    sVar5 = Curl_llist_count(list);
    if (sVar5 == 0) {
      CVar4 = CURLHE_NOHEADERS;
    }
    else {
      iVar8 = (easy->state).requests;
      CVar4 = CURLHE_NOREQUEST;
      if (request <= iVar8) {
        if (request != -1) {
          iVar8 = request;
        }
        pCVar6 = list->head;
        if (pCVar6 == (Curl_llist_element *)0x0) {
          local_58 = (Curl_llist_element *)0x0;
          local_50 = 0;
          pvVar7 = (void *)0x0;
          local_68 = (void *)0x0;
        }
        else {
          local_68 = (void *)0x0;
          local_50 = 0;
          local_58 = (Curl_llist_element *)0x0;
          do {
            pvVar7 = pCVar6->ptr;
            iVar3 = Curl_strcasecompare(*(char **)((long)pvVar7 + 0x18),name);
            if (((iVar3 != 0) && ((*(byte *)((long)pvVar7 + 0x2c) & type) != 0)) &&
               (*(int *)((long)pvVar7 + 0x28) == iVar8)) {
              local_50 = local_50 + 1;
              local_68 = pvVar7;
              local_58 = pCVar6;
            }
            pCVar6 = pCVar6->next;
          } while (pCVar6 != (Curl_llist_element *)0x0);
        }
        CVar4 = CURLHE_MISSING;
        if ((local_50 != 0) && (CVar4 = CURLHE_BADINDEX, nameindex < local_50)) {
          if (local_50 - 1 != nameindex) {
            pCVar6 = list->head;
            bVar9 = pCVar6 == (Curl_llist_element *)0x0;
            pCVar1 = local_58;
            if (!bVar9) {
              sVar5 = 0;
              do {
                pvVar7 = pCVar6->ptr;
                iVar3 = Curl_strcasecompare(*(char **)((long)pvVar7 + 0x18),name);
                if (((iVar3 != 0) && ((*(byte *)((long)pvVar7 + 0x2c) & type) != 0)) &&
                   (*(int *)((long)pvVar7 + 0x28) == iVar8)) {
                  pCVar1 = pCVar6;
                  if (sVar5 == nameindex) break;
                  sVar5 = sVar5 + 1;
                }
                pCVar6 = pCVar6->next;
                bVar9 = pCVar6 == (Curl_llist_element *)0x0;
                pCVar1 = local_58;
              } while (!bVar9);
            }
            local_58 = pCVar1;
            local_68 = pvVar7;
            if (bVar9) {
              return CURLHE_MISSING;
            }
          }
          *hout = &(easy->state).headerout;
          (easy->state).headerout.name = *(char **)((long)local_68 + 0x18);
          (easy->state).headerout.value = *(char **)((long)local_68 + 0x20);
          (easy->state).headerout.amount = local_50;
          (easy->state).headerout.index = nameindex;
          (easy->state).headerout.origin = *(byte *)((long)local_68 + 0x2c) | 0x8000000;
          (easy->state).headerout.anchor = local_58;
          CVar4 = CURLHE_OK;
        }
      }
    }
  }
  return CVar4;
}

Assistant:

CURLHcode curl_easy_header(CURL *easy,
                           const char *name,
                           size_t nameindex,
                           unsigned int type,
                           int request,
                           struct curl_header **hout)
{
  struct Curl_llist_element *e;
  struct Curl_llist_element *e_pick = NULL;
  struct Curl_easy *data = easy;
  size_t match = 0;
  size_t amount = 0;
  struct Curl_header_store *hs = NULL;
  struct Curl_header_store *pick = NULL;
  if(!name || !hout || !data ||
     (type > (CURLH_HEADER|CURLH_TRAILER|CURLH_CONNECT|CURLH_1XX|
              CURLH_PSEUDO)) || !type || (request < -1))
    return CURLHE_BAD_ARGUMENT;
  if(!Curl_llist_count(&data->state.httphdrs))
    return CURLHE_NOHEADERS; /* no headers available */
  if(request > data->state.requests)
    return CURLHE_NOREQUEST;
  if(request == -1)
    request = data->state.requests;

  /* we need a first round to count amount of this header */
  for(e = data->state.httphdrs.head; e; e = e->next) {
    hs = e->ptr;
    if(strcasecompare(hs->name, name) &&
       (hs->type & type) &&
       (hs->request == request)) {
      amount++;
      pick = hs;
      e_pick = e;
    }
  }
  if(!amount)
    return CURLHE_MISSING;
  else if(nameindex >= amount)
    return CURLHE_BADINDEX;

  if(nameindex == amount - 1)
    /* if the last or only occurrence is what's asked for, then we know it */
    hs = pick;
  else {
    for(e = data->state.httphdrs.head; e; e = e->next) {
      hs = e->ptr;
      if(strcasecompare(hs->name, name) &&
         (hs->type & type) &&
         (hs->request == request) &&
         (match++ == nameindex)) {
        e_pick = e;
        break;
      }
    }
    if(!e) /* this shouldn't happen */
      return CURLHE_MISSING;
  }
  /* this is the name we want */
  copy_header_external(data, hs, nameindex, amount, e_pick, hout);
  return CURLHE_OK;
}